

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pow_tests.cpp
# Opt level: O2

void __thiscall
pow_tests::CheckProofOfWork_test_negative_target::test_method
          (CheckProofOfWork_test_negative_target *this)

{
  long lVar1;
  bool bVar2;
  uint32_t nBits;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  check_type cVar3;
  char *local_228;
  char *local_220;
  __pthread_internal_list local_218;
  assertion_result local_208;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 local_1d0;
  undefined7 uStack_1cf;
  undefined1 uStack_1c8;
  undefined7 uStack_1c7;
  undefined1 uStack_1c0;
  undefined7 uStack_1bf;
  undefined8 uStack_1b8;
  undefined1 local_1b0 [32];
  Params consensus;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CreateChainParams((ArgsManager *)local_1b0,
                    (ChainType)(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node.args);
  Consensus::Params::Params(&consensus,(Params *)local_1b0._0_8_);
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            ((unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> *)local_1b0);
  UintToArith256((arith_uint256 *)local_1b0,&consensus.powLimit);
  nBits = arith_uint256::GetCompact((arith_uint256 *)local_1b0,true);
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
  local_1d8 = "";
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x5a;
  file.m_begin = (iterator)&local_1e0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1f0,msg);
  local_1d0 = 1;
  uStack_1cf = 0;
  uStack_1c8 = 0;
  uStack_1c7 = 0;
  uStack_1c0 = 0;
  uStack_1bf = 0;
  uStack_1b8 = 0;
  _cVar3 = CHECK_PRED;
  bVar2 = CheckProofOfWork((uint256)ZEXT832(1),nBits,&consensus);
  local_208.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar2;
  local_208.m_message.px = (element_type *)0x0;
  local_208.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0._24_8_ = &local_218;
  local_218.__prev = (__pthread_internal_list *)0xbcd2c7;
  local_218.__next = (__pthread_internal_list *)0xbcd2f0;
  local_1b0[8] = '\0';
  local_1b0._0_8_ = &PTR__lazy_ostream_011481f0;
  local_1b0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
  local_220 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_208,(lazy_ostream *)local_1b0,1,0,WARN,_cVar3,(size_t)&local_228,0x5a);
  boost::detail::shared_count::~shared_count(&local_208.m_message.pn);
  Consensus::Params::~Params(&consensus);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(CheckProofOfWork_test_negative_target)
{
    const auto consensus = CreateChainParams(*m_node.args, ChainType::MAIN)->GetConsensus();
    uint256 hash;
    unsigned int nBits;
    nBits = UintToArith256(consensus.powLimit).GetCompact(true);
    hash = uint256{1};
    BOOST_CHECK(!CheckProofOfWork(hash, nBits, consensus));
}